

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O2

void __thiscall
CMeshClosestPointMapper::TcSeamlessPatch::AddNextStepFi(TcSeamlessPatch *this,int fi)

{
  int iVar1;
  int *piVar2;
  value_type_conflict3 local_4;
  
  piVar2 = (this->m_nextStepFis).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  do {
    if (piVar2 == (this->m_nextStepFis).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      std::vector<int,_std::allocator<int>_>::push_back(&this->m_nextStepFis,&local_4);
      return;
    }
    iVar1 = *piVar2;
    piVar2 = piVar2 + 1;
  } while (iVar1 != fi);
  return;
}

Assistant:

void AddNextStepFi(int fi)
    {
      for (int nextStepFi : m_nextStepFis)
      {
        if (fi == nextStepFi)
          return;
      }
      m_nextStepFis.push_back(fi);
    }